

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

string * __thiscall
chaiscript::Boxed_Number::to_string_abi_cxx11_(string *__return_storage_ptr__,Boxed_Number *this)

{
  unsigned_short uVar1;
  short sVar2;
  Common_Types CVar3;
  uint uVar4;
  unsigned_long __val;
  long __val_00;
  undefined8 *puVar5;
  
  CVar3 = get_common_type(&this->bv);
  switch(CVar3) {
  case t_int32:
  case t_int8:
    uVar4 = get_as<int>(this);
    goto LAB_003889bc;
  case t_double:
    to_string_aux<double>(__return_storage_ptr__,&this->bv);
    break;
  case t_uint8:
  case t_uint32:
    uVar4 = get_as<unsigned_int>(this);
    std::__cxx11::to_string(__return_storage_ptr__,uVar4);
    break;
  case t_uint16:
    uVar1 = get_as<unsigned_short>(this);
    uVar4 = (uint)uVar1;
    goto LAB_003889bc;
  case t_int16:
    sVar2 = get_as<short>(this);
    uVar4 = (uint)sVar2;
LAB_003889bc:
    std::__cxx11::to_string(__return_storage_ptr__,uVar4);
    break;
  case t_uint64:
    __val = get_as<unsigned_long>(this);
    std::__cxx11::to_string(__return_storage_ptr__,__val);
    break;
  case t_int64:
    __val_00 = get_as<long>(this);
    std::__cxx11::to_string(__return_storage_ptr__,__val_00);
    break;
  case t_float:
    to_string_aux<float>(__return_storage_ptr__,&this->bv);
    break;
  case t_long_double:
    to_string_aux<long_double>(__return_storage_ptr__,&this->bv);
    break;
  default:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = &PTR__bad_cast_004a2090;
    __cxa_throw(puVar5,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return std::to_string(get_as<int32_t>());
        case Common_Types::t_uint8:
          return std::to_string(get_as<uint32_t>());
        case Common_Types::t_int8:
          return std::to_string(get_as<int32_t>());
        case Common_Types::t_uint16:
          return std::to_string(get_as<uint16_t>());
        case Common_Types::t_int16:
          return std::to_string(get_as<int16_t>());
        case Common_Types::t_uint32:
          return std::to_string(get_as<uint32_t>());
        case Common_Types::t_uint64:
          return std::to_string(get_as<uint64_t>());
        case Common_Types::t_int64:
          return std::to_string(get_as<int64_t>());
        case Common_Types::t_double:
          return to_string_aux<double>(bv);
        case Common_Types::t_float:
          return to_string_aux<float>(bv);
        case Common_Types::t_long_double:
          return to_string_aux<long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }